

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::EnumValueOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *to_msg_00;
  ulong uVar3;
  void *pvVar4;
  _func_int **pp_Var5;
  Nonnull<const_char_*> pcVar6;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_003e11ee;
  if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
    internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3),
               Arena::CopyConstruct<google::protobuf::UninterpretedOption>);
  }
  uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar1 & 0xf) == 0) goto LAB_003e116d;
  if ((uVar1 & 1) != 0) {
    pMVar2 = (MessageLite *)from_msg[4]._internal_metadata_.ptr_;
    if (pMVar2 != (MessageLite *)0x0) {
      to_msg_00 = (MessageLite *)to_msg[4]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar4 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar2);
        to_msg[4]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
      }
      else {
        FeatureSet::MergeImpl(to_msg_00,pMVar2);
      }
      goto LAB_003e1124;
    }
    MergeImpl((EnumValueOptions *)&stack0xffffffffffffffd0);
LAB_003e11e4:
    MergeImpl((EnumValueOptions *)&stack0xffffffffffffffd0);
LAB_003e11ee:
    MergeImpl();
  }
LAB_003e1124:
  if ((uVar1 & 2) != 0) {
    pMVar2 = (MessageLite *)from_msg[5]._vptr_MessageLite;
    if (pMVar2 == (MessageLite *)0x0) goto LAB_003e11e4;
    if ((MessageLite *)to_msg[5]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var5 = (_func_int **)
                Arena::CopyConstruct<google::protobuf::FieldOptions_FeatureSupport>(arena,pMVar2);
      to_msg[5]._vptr_MessageLite = pp_Var5;
    }
    else {
      FieldOptions_FeatureSupport::MergeImpl((MessageLite *)to_msg[5]._vptr_MessageLite,pMVar2);
    }
  }
  if ((uVar1 & 4) != 0) {
    *(char *)&to_msg[5]._internal_metadata_.ptr_ = (char)from_msg[5]._internal_metadata_.ptr_;
  }
  if ((uVar1 & 8) != 0) {
    *(undefined1 *)((long)&to_msg[5]._internal_metadata_.ptr_ + 1) =
         *(undefined1 *)((long)&from_msg[5]._internal_metadata_.ptr_ + 1);
  }
LAB_003e116d:
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
  internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)_EnumValueOptions_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void EnumValueOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumValueOptions*>(&to_msg);
  auto& from = static_cast<const EnumValueOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.feature_support_ != nullptr);
      if (_this->_impl_.feature_support_ == nullptr) {
        _this->_impl_.feature_support_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.feature_support_);
      } else {
        _this->_impl_.feature_support_->MergeFrom(*from._impl_.feature_support_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.debug_redact_ = from._impl_.debug_redact_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}